

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<double>::Subst_Forward(TPZSkylMatrix<double> *this,TPZFMatrix<double> *B)

{
  bool bVar1;
  int64_t col;
  long lVar2;
  int64_t iVar3;
  double *pdVar4;
  double **ppdVar5;
  double *row;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  double *BPtr;
  double *end_ki;
  double *elem_ki;
  double sum;
  int64_t k;
  int64_t j;
  int64_t dimension;
  char *in_stack_00000198;
  char *in_stack_000001a0;
  double *in_stack_ffffffffffffffb8;
  TPZFMatrix<double> *in_stack_ffffffffffffffc0;
  double local_30;
  long local_28;
  long local_20;
  
  col = TPZBaseMatrix::Rows(in_RSI);
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  if ((col != lVar2) || ((char)in_RDI[3] != '\x03')) {
    TPZMatrix<double>::Error(in_stack_000001a0,in_stack_00000198);
  }
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  for (local_20 = 0; iVar3 = TPZBaseMatrix::Cols(in_RSI), local_20 < iVar3; local_20 = local_20 + 1)
  {
    local_28 = 0;
    while( true ) {
      bVar1 = false;
      if (local_28 < lVar2) {
        pdVar4 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8,col);
        bVar1 = *pdVar4 == 0.0;
      }
      if (!bVar1) break;
      local_28 = local_28 + 1;
    }
    for (; local_28 < lVar2; local_28 = local_28 + 1) {
      local_30 = 0.0;
      ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_28);
      pdVar4 = *ppdVar5;
      ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_28 + 1);
      in_stack_ffffffffffffffc0 = (TPZFMatrix<double> *)*ppdVar5;
      row = TPZFMatrix<double>::operator()
                      (in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8,col);
      while (pdVar4 = pdVar4 + 1, pdVar4 < in_stack_ffffffffffffffc0) {
        local_30 = *pdVar4 * row[-1] + local_30;
        row = row + -1;
      }
      in_stack_ffffffffffffffb8 =
           TPZFMatrix<double>::operator()(in_stack_ffffffffffffffc0,(int64_t)row,col);
      *in_stack_ffffffffffffffb8 = *in_stack_ffffffffffffffb8 - local_30;
      ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_28);
      *in_stack_ffffffffffffffb8 = *in_stack_ffffffffffffffb8 / **ppdVar5;
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}